

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStorage.cpp
# Opt level: O1

int __thiscall OpenMD::DataStorage::copy(DataStorage *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  double *pdVar1;
  pointer pSVar2;
  SquareMatrix3<double> *in_RAX;
  SquareMatrix3<double> *extraout_RAX;
  SquareMatrix3<double> *extraout_RAX_00;
  SquareMatrix3<double> *extraout_RAX_01;
  SquareMatrix3<double> *extraout_RAX_02;
  SquareMatrix3<double> *extraout_RAX_03;
  SquareMatrix3<double> *extraout_RAX_04;
  SquareMatrix3<double> *extraout_RAX_05;
  void *pvVar3;
  size_t in_RCX;
  size_t sVar4;
  difference_type __d_1;
  int source;
  difference_type __d;
  
  source = (int)dst;
  if ((this->storageLayout_ & 1) != 0) {
    internalCopy<OpenMD::Vector3<double>>(this,&this->position,source,(size_t)src,in_RCX);
    in_RAX = extraout_RAX;
  }
  if ((this->storageLayout_ & 2) != 0) {
    internalCopy<OpenMD::Vector3<double>>(this,&this->velocity,source,(size_t)src,in_RCX);
    in_RAX = extraout_RAX_00;
  }
  if ((this->storageLayout_ & 4) != 0) {
    internalCopy<OpenMD::Vector3<double>>(this,&this->force,source,(size_t)src,in_RCX);
    in_RAX = extraout_RAX_01;
  }
  if ((this->storageLayout_ & 8) != 0) {
    pSVar2 = (this->aMat).
             super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    in_RAX = std::__copy_move<false,false,std::random_access_iterator_tag>::
             __copy_m<OpenMD::SquareMatrix3<double>*,OpenMD::SquareMatrix3<double>*>
                       (pSVar2 + source,pSVar2 + (long)(src + 1),pSVar2 + in_RCX);
  }
  if ((this->storageLayout_ & 0x10) != 0) {
    internalCopy<OpenMD::Vector3<double>>(this,&this->angularMomentum,source,(size_t)src,in_RCX);
    in_RAX = extraout_RAX_02;
  }
  if ((this->storageLayout_ & 0x20) != 0) {
    internalCopy<OpenMD::Vector3<double>>(this,&this->torque,source,(size_t)src,in_RCX);
    in_RAX = extraout_RAX_03;
  }
  if ((this->storageLayout_ & 0x40) != 0) {
    in_RAX = (SquareMatrix3<double> *)
             (this->particlePot).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar1 = (in_RAX->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0] +
             source;
    sVar4 = (long)in_RAX + (((long)src * 8 + 8) - (long)pdVar1);
    if (sVar4 != 0) {
      in_RAX = (SquareMatrix3<double> *)
               memmove((in_RAX->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                       data_[0] + in_RCX,pdVar1,sVar4);
    }
  }
  if ((this->storageLayout_ & 0x80) != 0) {
    in_RAX = (SquareMatrix3<double> *)
             (this->density).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar1 = (in_RAX->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0] +
             source;
    sVar4 = (long)in_RAX + (((long)src * 8 + 8) - (long)pdVar1);
    if (sVar4 != 0) {
      in_RAX = (SquareMatrix3<double> *)
               memmove((in_RAX->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                       data_[0] + in_RCX,pdVar1,sVar4);
    }
  }
  if ((this->storageLayout_ & 0x100) != 0) {
    in_RAX = (SquareMatrix3<double> *)
             (this->functional).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar1 = (in_RAX->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0] +
             source;
    sVar4 = (long)in_RAX + (((long)src * 8 + 8) - (long)pdVar1);
    if (sVar4 != 0) {
      in_RAX = (SquareMatrix3<double> *)
               memmove((in_RAX->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                       data_[0] + in_RCX,pdVar1,sVar4);
    }
  }
  if ((this->storageLayout_ & 0x200) != 0) {
    in_RAX = (SquareMatrix3<double> *)
             (this->functionalDerivative).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pdVar1 = (in_RAX->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0] +
             source;
    sVar4 = (long)in_RAX + (((long)src * 8 + 8) - (long)pdVar1);
    if (sVar4 != 0) {
      in_RAX = (SquareMatrix3<double> *)
               memmove((in_RAX->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                       data_[0] + in_RCX,pdVar1,sVar4);
    }
  }
  if ((this->storageLayout_ & 0x400) != 0) {
    internalCopy<OpenMD::Vector3<double>>(this,&this->dipole,source,(size_t)src,in_RCX);
    in_RAX = extraout_RAX_04;
  }
  if ((this->storageLayout_ & 0x800) != 0) {
    pSVar2 = (this->quadrupole).
             super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    in_RAX = std::__copy_move<false,false,std::random_access_iterator_tag>::
             __copy_m<OpenMD::SquareMatrix3<double>*,OpenMD::SquareMatrix3<double>*>
                       (pSVar2 + source,pSVar2 + (long)(src + 1),pSVar2 + in_RCX);
  }
  if ((this->storageLayout_ & 0x1000) != 0) {
    internalCopy<OpenMD::Vector3<double>>(this,&this->electricField,source,(size_t)src,in_RCX);
    in_RAX = extraout_RAX_05;
  }
  if ((this->storageLayout_ & 0x2000) != 0) {
    in_RAX = (SquareMatrix3<double> *)
             (this->skippedCharge).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar1 = (in_RAX->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0] +
             source;
    sVar4 = (long)in_RAX + (((long)src * 8 + 8) - (long)pdVar1);
    if (sVar4 != 0) {
      in_RAX = (SquareMatrix3<double> *)
               memmove((in_RAX->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                       data_[0] + in_RCX,pdVar1,sVar4);
    }
  }
  if ((this->storageLayout_ & 0x4000) != 0) {
    in_RAX = (SquareMatrix3<double> *)
             (this->flucQPos).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar1 = (in_RAX->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0] +
             source;
    sVar4 = (long)in_RAX + (((long)src * 8 + 8) - (long)pdVar1);
    if (sVar4 != 0) {
      in_RAX = (SquareMatrix3<double> *)
               memmove((in_RAX->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                       data_[0] + in_RCX,pdVar1,sVar4);
    }
  }
  if ((this->storageLayout_ & 0x8000) != 0) {
    in_RAX = (SquareMatrix3<double> *)
             (this->flucQVel).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar1 = (in_RAX->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0] +
             source;
    sVar4 = (long)in_RAX + (((long)src * 8 + 8) - (long)pdVar1);
    if (sVar4 != 0) {
      in_RAX = (SquareMatrix3<double> *)
               memmove((in_RAX->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                       data_[0] + in_RCX,pdVar1,sVar4);
    }
  }
  if ((this->storageLayout_ & 0x10000) != 0) {
    in_RAX = (SquareMatrix3<double> *)
             (this->flucQFrc).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar1 = (in_RAX->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0] +
             source;
    sVar4 = (long)in_RAX + (((long)src * 8 + 8) - (long)pdVar1);
    if (sVar4 != 0) {
      in_RAX = (SquareMatrix3<double> *)
               memmove((in_RAX->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                       data_[0] + in_RCX,pdVar1,sVar4);
    }
  }
  if ((this->storageLayout_ & 0x20000) != 0) {
    in_RAX = (SquareMatrix3<double> *)
             (this->sitePotential).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar1 = (in_RAX->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0] +
             source;
    sVar4 = (long)in_RAX + (((long)src * 8 + 8) - (long)pdVar1);
    if (sVar4 != 0) {
      pvVar3 = memmove((in_RAX->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                       data_[0] + in_RCX,pdVar1,sVar4);
      return (int)pvVar3;
    }
  }
  return (int)in_RAX;
}

Assistant:

void DataStorage::copy(int source, std::size_t num, std::size_t target) {
    if (num + target > size_) {
      // error
    }

    if (storageLayout_ & dslPosition) {
      internalCopy(position, source, num, target);
    }

    if (storageLayout_ & dslVelocity) {
      internalCopy(velocity, source, num, target);
    }

    if (storageLayout_ & dslForce) { internalCopy(force, source, num, target); }

    if (storageLayout_ & dslAmat) { internalCopy(aMat, source, num, target); }

    if (storageLayout_ & dslAngularMomentum) {
      internalCopy(angularMomentum, source, num, target);
    }

    if (storageLayout_ & dslTorque) {
      internalCopy(torque, source, num, target);
    }

    if (storageLayout_ & dslParticlePot) {
      internalCopy(particlePot, source, num, target);
    }

    if (storageLayout_ & dslDensity) {
      internalCopy(density, source, num, target);
    }

    if (storageLayout_ & dslFunctional) {
      internalCopy(functional, source, num, target);
    }

    if (storageLayout_ & dslFunctionalDerivative) {
      internalCopy(functionalDerivative, source, num, target);
    }

    if (storageLayout_ & dslDipole) {
      internalCopy(dipole, source, num, target);
    }

    if (storageLayout_ & dslQuadrupole) {
      internalCopy(quadrupole, source, num, target);
    }

    if (storageLayout_ & dslElectricField) {
      internalCopy(electricField, source, num, target);
    }

    if (storageLayout_ & dslSkippedCharge) {
      internalCopy(skippedCharge, source, num, target);
    }

    if (storageLayout_ & dslFlucQPosition) {
      internalCopy(flucQPos, source, num, target);
    }

    if (storageLayout_ & dslFlucQVelocity) {
      internalCopy(flucQVel, source, num, target);
    }
    if (storageLayout_ & dslFlucQForce) {
      internalCopy(flucQFrc, source, num, target);
    }

    if (storageLayout_ & dslSitePotential) {
      internalCopy(sitePotential, source, num, target);
    }
  }